

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<double>::
Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  int csize;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  value_type vVar4;
  
  vVar4 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::val(&fadexpr->fadexpr_);
  this->val_ = vVar4;
  csize = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::size(&fadexpr->fadexpr_);
  Vector<double>::Vector(&this->dx_,csize);
  this->defaultVal = 0.0;
  uVar1 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::size(&fadexpr->fadexpr_);
  if (uVar1 != 0) {
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      vVar4 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
              ::dx(&fadexpr->fadexpr_,(int)uVar3);
      (this->dx_).ptr_to_data[uVar3] = vVar4;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }